

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<cv::Mat> *this;
  float fVar1;
  float fVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  float *pfVar6;
  Vec<unsigned_char,_3> *m;
  uchar *puVar7;
  byte *pbVar8;
  ostream *poVar9;
  reference pvVar10;
  size_type sVar11;
  reference pvVar12;
  float *pfVar13;
  float *pfVar14;
  _InputArray *p_Var15;
  float fVar16;
  float fVar17;
  undefined4 extraout_XMM0_Db;
  double dVar18;
  undefined4 extraout_XMM0_Db_00;
  undefined8 uVar19;
  undefined8 extraout_XMM0_Qa;
  _InputArray local_1318;
  allocator<char> local_12f9;
  string local_12f8 [32];
  _OutputArray local_12d8;
  _InputArray local_12c0;
  Mat local_12a8 [8];
  Mat reconstructed_img;
  float local_1248;
  float local_1244;
  int local_1240;
  int local_123c;
  int i_4;
  int j_3;
  float local_1230;
  int local_122c;
  float lap_;
  int i_3;
  int j_2;
  int it;
  _InputArray local_1218;
  MatSize local_1200 [8];
  _InputArray *local_11f8;
  Mat *u;
  MatExpr local_1090 [8];
  Mat S_lap;
  Point_<int> local_1030;
  _InputArray local_1028;
  _OutputArray local_1010;
  _InputArray local_ff8;
  Point_<int> local_fe0;
  _InputArray local_fd8;
  _OutputArray local_fc0;
  _InputArray local_fa8;
  Mat local_f90 [8];
  Mat S_y_dy;
  Mat local_f30 [8];
  Mat S_x_dx;
  float edge_to_remove;
  float *s_y;
  float *s_x;
  int i_2;
  int j_1;
  Mat local_ea8 [8];
  Mat S_y;
  MatSize local_e48 [8];
  Mat local_e40 [8];
  Mat S_x;
  ulong local_de0;
  size_t k_1;
  undefined1 local_dd0 [8];
  vector<cv::Mat,_std::allocator<cv::Mat>_> re_channels;
  undefined1 local_db0 [8];
  vector<cv::Mat,_std::allocator<cv::Mat>_> re_log_channels;
  _InputArray local_d80;
  _InputArray local_d68;
  Point_<int> local_d50;
  _InputArray local_d48;
  _OutputArray local_d30;
  _InputArray local_d18;
  Point_<int> local_d00;
  _InputArray local_cf8;
  _OutputArray local_ce0;
  _InputArray local_cc8;
  Mat local_cb0 [8];
  Mat dy;
  Mat local_c50 [8];
  Mat dx;
  Mat local_bf0 [8];
  Mat grad_iii;
  _OutputArray local_b90;
  _InputArray local_b78;
  _InputArray local_b60;
  Point_<int> local_b48;
  _InputArray local_b40;
  _OutputArray local_b28;
  _InputArray local_b10;
  Point_<int> local_af8;
  _InputArray local_af0;
  _OutputArray local_ad8;
  _InputArray local_ac0;
  float local_aa4;
  int local_aa0;
  float int_val;
  int k;
  int l;
  _OutputArray local_a90;
  Mat local_a78 [8];
  Mat float_img;
  int local_a6c;
  ulong local_a18;
  size_t i_1;
  _InputArray local_9f8;
  undefined1 local_9e0 [8];
  vector<cv::Mat,_std::allocator<cv::Mat>_> log_dy;
  vector<cv::Mat,_std::allocator<cv::Mat>_> log_dx;
  vector<cv::Mat,_std::allocator<cv::Mat>_> log_grad;
  vector<cv::Mat,_std::allocator<cv::Mat>_> bgr_channels_log;
  vector<cv::Mat,_std::allocator<cv::Mat>_> bgr_channels;
  allocator<char> local_949;
  string local_948 [39];
  allocator<char> local_921;
  string local_920;
  undefined1 local_900 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rois;
  String local_8e0;
  undefined1 local_8c0 [8];
  string roi_str;
  string local_898 [32];
  undefined1 local_878 [8];
  Rect roi;
  Mat edges_to_remove;
  Mat local_800 [4];
  int key;
  _InputArray local_6a0;
  _OutputArray local_688;
  _InputArray local_670;
  byte local_651;
  int local_650;
  int iStack_64c;
  bool calib_done;
  int max_val;
  int val_curr;
  int val;
  string slider_name;
  string local_618 [8];
  string winname;
  Mat illuminant_invariant_img_exp;
  MatSize local_598 [8];
  Mat local_590 [8];
  Mat illuminant_invariant_img;
  anon_class_1_0_00000001 local_529;
  float local_528;
  anon_class_1_0_00000001 combineLogImages;
  float scale;
  int iStack_51c;
  Vec3b color;
  int i;
  int j;
  Mat log_b_g;
  Mat local_4b8 [8];
  Mat log_r_g;
  _InputArray local_458;
  allocator<char> local_439;
  string local_438 [32];
  string local_418 [8];
  Mat img;
  int local_40c;
  allocator<char> local_3b1;
  String local_3b0;
  int local_390;
  allocator<char> local_389;
  int mode;
  byte local_362;
  allocator<char> local_361;
  undefined1 local_360 [6];
  bool calibrate;
  float local_340;
  allocator<char> local_339;
  float c2;
  float local_318;
  allocator<char> local_311;
  float c1;
  float local_2f0;
  allocator<char> local_2e9;
  float ii_img_canny_thrs;
  float local_2c4;
  undefined1 local_2c0 [4];
  float img_canny_thrs;
  string img1;
  string local_298 [32];
  CommandLineParser local_278 [8];
  CommandLineParser parser;
  allocator<char> local_269;
  string local_268 [8];
  string keys;
  MatExpr local_e8 [8];
  Mat filter_gy;
  Mat local_78 [8];
  Mat filter_gx;
  char **argv_local;
  int argc_local;
  
  cv::Mat::Mat(local_78,1,3,5);
  pfVar6 = cv::Mat::at<float>(local_78,0);
  *pfVar6 = -0.5;
  pfVar6 = cv::Mat::at<float>(local_78,1);
  *pfVar6 = 0.0;
  pfVar6 = cv::Mat::at<float>(local_78,2);
  *pfVar6 = 0.5;
  cv::Mat::t();
  cv::MatExpr::operator_cast_to_Mat(local_e8);
  cv::MatExpr::~MatExpr((MatExpr *)(keys.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_268,
             "{help h usage ? |      | print this message                                                        }{@image1        |      | image1 for compare                                                        }{roi            |      | roi to delete canny edges                                                 }{thrs1          |200   | Canny threshold for grayscale image                                       }{thrs2          |200   | Canny threshold for invariant image                                       }{c1             |0.5463| Illuminant invariant direction c1                                         }{c2             |-0.837| Illuminant invariant direction c2                                         }{calibrate      |false | Manually calibrate [c1, c2] direction                                     }{mode           |1     | 1 = Use roi to clear non shadow edges, 0 = try to figure out shadow edges }"
             ,&local_269);
  std::allocator<char>::~allocator(&local_269);
  cv::CommandLineParser::CommandLineParser(local_278,argc,argv,local_268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_298,"help",(allocator<char> *)(img1.field_2._M_local_buf + 0xf));
  bVar3 = cv::CommandLineParser::has((string *)local_278);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)(img1.field_2._M_local_buf + 0xf));
  if ((bVar3 & 1) == 0) {
    cv::CommandLineParser::get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
               local_278,0,true);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ii_img_canny_thrs,"thrs1",&local_2e9);
    fVar16 = cv::CommandLineParser::get<float>(local_278,(String *)&ii_img_canny_thrs,true);
    std::__cxx11::string::~string((string *)&ii_img_canny_thrs);
    std::allocator<char>::~allocator(&local_2e9);
    local_2c4 = fVar16;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&c1,"thrs2",&local_311);
    fVar16 = cv::CommandLineParser::get<float>(local_278,(String *)&c1,true);
    std::__cxx11::string::~string((string *)&c1);
    std::allocator<char>::~allocator(&local_311);
    local_2f0 = fVar16;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&c2,"c1",&local_339);
    fVar16 = cv::CommandLineParser::get<float>(local_278,(String *)&c2,true);
    std::__cxx11::string::~string((string *)&c2);
    std::allocator<char>::~allocator(&local_339);
    local_318 = fVar16;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_360,"c2",&local_361);
    fVar16 = cv::CommandLineParser::get<float>(local_278,(String *)local_360,true);
    std::__cxx11::string::~string((string *)local_360);
    std::allocator<char>::~allocator(&local_361);
    local_340 = fVar16;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&mode,"calibrate",&local_389);
    bVar4 = cv::CommandLineParser::get<bool>(local_278,(String *)&mode,true);
    std::__cxx11::string::~string((string *)&mode);
    std::allocator<char>::~allocator(&local_389);
    local_362 = bVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"mode",&local_3b1);
    iVar5 = cv::CommandLineParser::get<int>(local_278,&local_3b0,true);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator(&local_3b1);
    local_390 = iVar5;
    cv::imread(local_418,(int)local_2c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_438,"Original",&local_439);
    cv::_InputArray::_InputArray(&local_458,(Mat *)local_418);
    cv::imshow(local_438,&local_458);
    cv::_InputArray::~_InputArray(&local_458);
    std::__cxx11::string::~string(local_438);
    std::allocator<char>::~allocator(&local_439);
    cv::Mat::Mat(local_4b8,_img,local_40c,5);
    cv::Mat::Mat((Mat *)&i,_img,local_40c,5);
    for (iStack_51c = 0; iStack_51c < _img; iStack_51c = iStack_51c + 1) {
      for (scale = 0.0; (int)scale < local_40c; scale = (float)((int)scale + 1)) {
        m = cv::Mat::at<cv::Vec<unsigned_char,3>>((Mat *)local_418,iStack_51c,(int)scale);
        cv::Vec<unsigned_char,_3>::Vec((Vec<unsigned_char,_3> *)&stack0xfffffffffffffadd,m);
        pfVar6 = cv::Mat::at<float>(local_4b8,iStack_51c,(int)scale);
        *pfVar6 = 0.0;
        pfVar6 = cv::Mat::at<float>((Mat *)&i,iStack_51c,(int)scale);
        *pfVar6 = 0.0;
        puVar7 = cv::Vec<unsigned_char,_3>::operator[]
                           ((Vec<unsigned_char,_3> *)&stack0xfffffffffffffadd,1);
        if (*puVar7 != '\0') {
          pbVar8 = cv::Vec<unsigned_char,_3>::operator[]
                             ((Vec<unsigned_char,_3> *)&stack0xfffffffffffffadd,1);
          local_528 = (float)*pbVar8;
          puVar7 = cv::Vec<unsigned_char,_3>::operator[]
                             ((Vec<unsigned_char,_3> *)&stack0xfffffffffffffadd,2);
          if (*puVar7 != '\0') {
            pbVar8 = cv::Vec<unsigned_char,_3>::operator[]
                               ((Vec<unsigned_char,_3> *)&stack0xfffffffffffffadd,2);
            dVar18 = std::log((double)CONCAT44(extraout_XMM0_Db,(float)*pbVar8 / local_528));
            pfVar6 = cv::Mat::at<float>(local_4b8,iStack_51c,(int)scale);
            *pfVar6 = SUB84(dVar18,0);
          }
          puVar7 = cv::Vec<unsigned_char,_3>::operator[]
                             ((Vec<unsigned_char,_3> *)&stack0xfffffffffffffadd,0);
          if (*puVar7 != '\0') {
            pbVar8 = cv::Vec<unsigned_char,_3>::operator[]
                               ((Vec<unsigned_char,_3> *)&stack0xfffffffffffffadd,0);
            dVar18 = std::log((double)CONCAT44(extraout_XMM0_Db_00,(float)*pbVar8 / local_528));
            pfVar6 = cv::Mat::at<float>((Mat *)&i,iStack_51c,(int)scale);
            *pfVar6 = SUB84(dVar18,0);
          }
        }
      }
    }
    cv::MatSize::operator()(local_598);
    cv::Mat::Mat(local_590,local_598,5);
    main::anon_class_1_0_00000001::operator()
              (&local_529,local_4b8,(Mat *)&i,local_590,local_318,local_340);
    cv::Mat::Mat((Mat *)(winname.field_2._M_local_buf + 8));
    if ((local_362 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_618,"Invariant direction slider",
                 (allocator<char> *)(slider_name.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(slider_name.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&val,"ids",(allocator<char> *)((long)&val_curr + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&val_curr + 3));
      cv::namedWindow(local_618,1);
      max_val = 0;
      iStack_64c = -1;
      local_650 = 1000;
      uVar19 = cv::createTrackbar((string *)&val,local_618,&max_val,1000,onIDSslider,(void *)0x0);
      local_651 = 0;
      while (((local_651 ^ 0xff) & 1) != 0) {
        if (max_val != iStack_64c) {
          iStack_64c = max_val;
          dVar18 = std::cos((double)CONCAT44((int)((ulong)uVar19 >> 0x20),
                                             ((float)max_val / (float)local_650 +
                                             (float)max_val / (float)local_650) * 3.141592));
          local_318 = SUB84(dVar18,0);
          dVar18 = std::sin((double)(ulong)(uint)(((float)max_val / (float)local_650 +
                                                  (float)max_val / (float)local_650) * 3.141592));
          local_340 = SUB84(dVar18,0);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_318);
          poVar9 = std::operator<<(poVar9,"   ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_340);
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          main::anon_class_1_0_00000001::operator()
                    (&local_529,local_4b8,(Mat *)&i,local_590,local_318,local_340);
          cv::_InputArray::_InputArray(&local_670,local_590);
          cv::_OutputArray::_OutputArray(&local_688,(Mat *)(winname.field_2._M_local_buf + 8));
          cv::exp(&local_670,&local_688);
          cv::_OutputArray::~_OutputArray(&local_688);
          cv::_InputArray::~_InputArray(&local_670);
          cv::operator/(local_800,2.0);
          cv::_InputArray::_InputArray(&local_6a0,(MatExpr *)local_800);
          cv::imshow(local_618,&local_6a0);
          cv::_InputArray::~_InputArray(&local_6a0);
          cv::MatExpr::~MatExpr((MatExpr *)local_800);
        }
        iVar5 = cv::waitKey(0x32);
        uVar19 = extraout_XMM0_Qa;
        if (iVar5 == 0x1b) {
          local_651 = 1;
        }
      }
      std::__cxx11::string::~string((string *)&val);
      std::__cxx11::string::~string(local_618);
    }
    cv::Mat::Mat((Mat *)&roi.width);
    if (local_390 == 0) {
      calculateShadowEdges
                (local_590,(Mat *)local_418,(Mat *)&roi.width,(int)local_2f0,(int)local_2c4);
    }
    else if (local_390 == 1) {
      cv::Rect_<int>::Rect_((Rect_<int> *)local_878,0,0,local_40c,_img);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_898,"roi",(allocator<char> *)(roi_str.field_2._M_local_buf + 0xf));
      bVar3 = cv::CommandLineParser::has((string *)local_278);
      std::__cxx11::string::~string(local_898);
      std::allocator<char>::~allocator((allocator<char> *)(roi_str.field_2._M_local_buf + 0xf));
      if ((bVar3 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8e0,"roi",
                   (allocator<char> *)
                   ((long)&rois.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cv::CommandLineParser::get<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c0,
                   local_278,&local_8e0,true);
        std::__cxx11::string::~string((string *)&local_8e0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&rois.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_920,"x",&local_921);
        split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_900,(string *)local_8c0,&local_920);
        std::__cxx11::string::~string((string *)&local_920);
        std::allocator<char>::~allocator(&local_921);
        sVar11 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_900);
        if (sVar11 != 4) {
          __assert_fail("rois.size() == 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/siposcsaba89[P]sriid/main.cpp"
                        ,0x8d,"int main(int, const char **)");
        }
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_900,0);
        fVar16 = std::__cxx11::stof(pvVar10,(size_t *)0x0);
        local_878._0_4_ = (undefined4)(fVar16 * (float)roi.x);
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_900,1);
        fVar16 = std::__cxx11::stof(pvVar10,(size_t *)0x0);
        local_878._4_4_ = (undefined4)(fVar16 * (float)roi.y);
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_900,2);
        fVar16 = std::__cxx11::stof(pvVar10,(size_t *)0x0);
        roi.x = (int)(fVar16 * (float)roi.x);
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_900,3);
        fVar16 = std::__cxx11::stof(pvVar10,(size_t *)0x0);
        roi.y = (int)(fVar16 * (float)roi.y);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_900);
        std::__cxx11::string::~string((string *)local_8c0);
      }
      calculateShadowEdgesRoi((Mat *)local_418,(Rect *)local_878,(Mat *)&roi.width,(int)local_2c4);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_948,"Edges to remove",&local_949);
    cv::_InputArray::_InputArray
              ((_InputArray *)
               &bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Mat *)&roi.width);
    cv::imshow(local_948,
               (_InputArray *)
               &bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    cv::_InputArray::~_InputArray
              ((_InputArray *)
               &bgr_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string(local_948);
    std::allocator<char>::~allocator(&local_949);
    cv::waitKey(1);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
               &bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
               &log_grad.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
               &log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
               &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_9e0);
    cv::_InputArray::_InputArray(&local_9f8,(Mat *)local_418);
    cv::_OutputArray::_OutputArray
              ((_OutputArray *)&i_1,
               (vector<cv::Mat,_std::allocator<cv::Mat>_> *)
               &bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    cv::split(&local_9f8,(_OutputArray *)&i_1);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&i_1);
    cv::_InputArray::~_InputArray(&local_9f8);
    sVar11 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                       ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                        &bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
               &log_grad.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,sVar11);
    sVar11 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                       ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                        &bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
               &log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,sVar11);
    sVar11 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                       ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                        &bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
               &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,sVar11);
    sVar11 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                       ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                        &bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_9e0,sVar11);
    for (local_a18 = 0;
        sVar11 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                           ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                            &bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage), local_a18 < sVar11;
        local_a18 = local_a18 + 1) {
      cv::Mat::Mat(local_a78);
      pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                           &bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,local_a18);
      cv::_OutputArray::_OutputArray(&local_a90,local_a78);
      cv::Mat::convertTo((_OutputArray *)pvVar12,(int)&local_a90,1.0,0.0);
      cv::_OutputArray::~_OutputArray(&local_a90);
      pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                           &log_grad.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_a18);
      cv::MatSize::operator()((MatSize *)&k);
      cv::Mat::create(pvVar12,&k,5);
      for (int_val = 0.0; (int)int_val < _float_img; int_val = (float)((int)int_val + 1)) {
        for (local_aa0 = 0; local_aa0 < local_a6c; local_aa0 = local_aa0 + 1) {
          pfVar6 = cv::Mat::at<float>(local_a78,(int)int_val,local_aa0);
          fVar16 = *pfVar6;
          local_aa4 = fVar16;
          fVar17 = std::numeric_limits<float>::epsilon();
          if (fVar16 < fVar17) {
            local_aa4 = 0.0001;
          }
          dVar18 = std::log((double)(ulong)(uint)local_aa4);
          pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                               &log_grad.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_a18);
          pfVar6 = cv::Mat::at<float>(pvVar12,(int)int_val,local_aa0);
          *pfVar6 = SUB84(dVar18,0);
        }
      }
      pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                           &log_grad.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_a18);
      cv::_InputArray::_InputArray(&local_ac0,pvVar12);
      pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                           &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_a18);
      cv::_OutputArray::_OutputArray(&local_ad8,pvVar12);
      cv::_InputArray::_InputArray(&local_af0,local_78);
      cv::Point_<int>::Point_(&local_af8,-1,-1);
      cv::filter2D(0,&local_ac0,&local_ad8,5,&local_af0,&local_af8,4);
      cv::_InputArray::~_InputArray(&local_af0);
      cv::_OutputArray::~_OutputArray(&local_ad8);
      cv::_InputArray::~_InputArray(&local_ac0);
      pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                           &log_grad.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_a18);
      cv::_InputArray::_InputArray(&local_b10,pvVar12);
      pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_9e0,local_a18);
      cv::_OutputArray::_OutputArray(&local_b28,pvVar12);
      cv::_InputArray::_InputArray(&local_b40,(Mat *)local_e8);
      cv::Point_<int>::Point_(&local_b48,-1,-1);
      cv::filter2D(0,&local_b10,&local_b28,5,&local_b40,&local_b48,4);
      cv::_InputArray::~_InputArray(&local_b40);
      cv::_OutputArray::~_OutputArray(&local_b28);
      cv::_InputArray::~_InputArray(&local_b10);
      pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                           &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_a18);
      cv::_InputArray::_InputArray(&local_b60,pvVar12);
      pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_9e0,local_a18);
      cv::_InputArray::_InputArray(&local_b78,pvVar12);
      pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                           &log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_a18);
      cv::_OutputArray::_OutputArray(&local_b90,pvVar12);
      cv::magnitude(&local_b60,&local_b78,&local_b90);
      cv::_OutputArray::~_OutputArray(&local_b90);
      cv::_InputArray::~_InputArray(&local_b78);
      cv::_InputArray::~_InputArray(&local_b60);
      cv::Mat::~Mat(local_a78);
    }
    cv::Mat::Mat(local_bf0);
    cv::Mat::Mat(local_c50);
    cv::Mat::Mat(local_cb0);
    cv::_InputArray::_InputArray(&local_cc8,local_590);
    cv::_OutputArray::_OutputArray(&local_ce0,local_c50);
    cv::_InputArray::_InputArray(&local_cf8,local_78);
    cv::Point_<int>::Point_(&local_d00,-1,-1);
    cv::filter2D(0,&local_cc8,&local_ce0,5,&local_cf8,&local_d00,4);
    cv::_InputArray::~_InputArray(&local_cf8);
    cv::_OutputArray::~_OutputArray(&local_ce0);
    cv::_InputArray::~_InputArray(&local_cc8);
    cv::_InputArray::_InputArray(&local_d18,local_590);
    cv::_OutputArray::_OutputArray(&local_d30,local_cb0);
    cv::_InputArray::_InputArray(&local_d48,(Mat *)local_e8);
    cv::Point_<int>::Point_(&local_d50,-1,-1);
    cv::filter2D(0,&local_d18,&local_d30,5,&local_d48,&local_d50,4);
    cv::_InputArray::~_InputArray(&local_d48);
    cv::_OutputArray::~_OutputArray(&local_d30);
    cv::_InputArray::~_InputArray(&local_d18);
    cv::_InputArray::_InputArray(&local_d68,local_c50);
    cv::_InputArray::_InputArray(&local_d80,local_cb0);
    cv::_OutputArray::_OutputArray
              ((_OutputArray *)
               &re_log_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_bf0);
    cv::magnitude(&local_d68,&local_d80,
                  (_OutputArray *)
                  &re_log_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    cv::_OutputArray::~_OutputArray
              ((_OutputArray *)
               &re_log_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    cv::_InputArray::~_InputArray(&local_d80);
    cv::_InputArray::~_InputArray(&local_d68);
    cv::Mat::~Mat(local_cb0);
    cv::Mat::~Mat(local_c50);
    sVar11 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                       ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                        &bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    this = (allocator<cv::Mat> *)
           ((long)&re_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<cv::Mat>::allocator(this);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_db0,sVar11,this);
    std::allocator<cv::Mat>::~allocator
              ((allocator<cv::Mat> *)
               ((long)&re_channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    sVar11 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                       ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                        &bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<cv::Mat>::allocator((allocator<cv::Mat> *)((long)&k_1 + 7));
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_dd0,sVar11,
               (allocator<cv::Mat> *)((long)&k_1 + 7));
    std::allocator<cv::Mat>::~allocator((allocator<cv::Mat> *)((long)&k_1 + 7));
    for (local_de0 = 0;
        sVar11 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                           ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                            &bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage), local_de0 < sVar11;
        local_de0 = local_de0 + 1) {
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                 &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_de0);
      cv::MatSize::operator()(local_e48);
      cv::Mat::Mat(local_e40,local_e48,5);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                 &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_de0);
      cv::MatSize::operator()((MatSize *)&i_2);
      cv::Mat::Mat(local_ea8,&i_2,5);
      for (s_x._4_4_ = 0;
          pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                               &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage,local_de0),
          s_x._4_4_ < *(int *)(pvVar12 + 8); s_x._4_4_ = s_x._4_4_ + 1) {
        for (s_x._0_4_ = 0;
            pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                                ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                                 &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_de0),
            (int)s_x < *(int *)(pvVar12 + 0xc); s_x._0_4_ = (int)s_x + 1) {
          pfVar6 = cv::Mat::at<float>(local_e40,s_x._4_4_,(int)s_x);
          pfVar13 = cv::Mat::at<float>(local_ea8,s_x._4_4_,(int)s_x);
          pbVar8 = cv::Mat::at<unsigned_char>((Mat *)&roi.width,s_x._4_4_,(int)s_x);
          if ((float)*pbVar8 <= 100.0) {
            pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                                ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                                 &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_de0);
            pfVar14 = cv::Mat::at<float>(pvVar12,s_x._4_4_,(int)s_x);
            *pfVar6 = *pfVar14;
            pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                                ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_9e0,local_de0);
            pfVar6 = cv::Mat::at<float>(pvVar12,s_x._4_4_,(int)s_x);
            *pfVar13 = *pfVar6;
          }
          else {
            *pfVar6 = 0.0;
            *pfVar13 = 0.0;
          }
        }
      }
      cv::Mat::Mat(local_f30);
      cv::Mat::Mat(local_f90);
      cv::_InputArray::_InputArray(&local_fa8,local_e40);
      cv::_OutputArray::_OutputArray(&local_fc0,local_f30);
      cv::_InputArray::_InputArray(&local_fd8,local_78);
      cv::Point_<int>::Point_(&local_fe0,-1,-1);
      cv::filter2D(0,&local_fa8,&local_fc0,5,&local_fd8,&local_fe0,4);
      cv::_InputArray::~_InputArray(&local_fd8);
      cv::_OutputArray::~_OutputArray(&local_fc0);
      cv::_InputArray::~_InputArray(&local_fa8);
      cv::_InputArray::_InputArray(&local_ff8,local_ea8);
      cv::_OutputArray::_OutputArray(&local_1010,local_f90);
      cv::_InputArray::_InputArray(&local_1028,(Mat *)local_e8);
      cv::Point_<int>::Point_(&local_1030,-1,-1);
      cv::filter2D(0,&local_ff8,&local_1010,5,&local_1028,&local_1030,4);
      cv::_InputArray::~_InputArray(&local_1028);
      cv::_OutputArray::~_OutputArray(&local_1010);
      cv::_InputArray::~_InputArray(&local_ff8);
      cv::operator+((Mat *)&u,local_f30);
      cv::MatExpr::operator_cast_to_Mat(local_1090);
      cv::MatExpr::~MatExpr((MatExpr *)&u);
      p_Var15 = (_InputArray *)
                std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_db0,local_de0);
      local_11f8 = p_Var15;
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                 &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_de0);
      cv::MatSize::operator()(local_1200);
      cv::Mat::create(p_Var15,local_1200,5);
      p_Var15 = local_11f8;
      _j_2 = std::log<int>(0x6f);
      cv::_InputArray::_InputArray(&local_1218,(double *)&j_2);
      cv::noArray();
      cv::Mat::setTo(p_Var15,&local_1218);
      cv::_InputArray::~_InputArray(&local_1218);
      for (i_3 = 0; i_3 < 20000; i_3 = i_3 + 1) {
        for (lap_ = 2.8026e-45; fVar16 = lap_,
            pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                                ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                                 &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_de0),
            (int)fVar16 < *(int *)(pvVar12 + 8) + -2; lap_ = (float)((int)lap_ + 1)) {
          for (local_122c = 2; iVar5 = local_122c,
              pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                                  ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                                   &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,local_de0),
              iVar5 < *(int *)(pvVar12 + 0xc) + -2; local_122c = local_122c + 1) {
            pfVar6 = cv::Mat::at<float>((Mat *)local_11f8,(int)lap_,local_122c + -2);
            fVar16 = *pfVar6;
            pfVar6 = cv::Mat::at<float>((Mat *)local_11f8,(int)lap_,local_122c + 2);
            fVar17 = *pfVar6;
            pfVar6 = cv::Mat::at<float>((Mat *)local_11f8,(int)lap_ + -2,local_122c);
            fVar1 = *pfVar6;
            pfVar6 = cv::Mat::at<float>((Mat *)local_11f8,(int)lap_ + 2,local_122c);
            fVar2 = *pfVar6;
            pfVar6 = cv::Mat::at<float>((Mat *)local_11f8,(int)lap_,local_122c);
            fVar17 = (*pfVar6 * -4.0 + fVar16 + fVar17 + fVar1 + fVar2) * 0.25;
            local_1230 = fVar17;
            pfVar6 = cv::Mat::at<float>((Mat *)local_1090,(int)lap_,local_122c);
            fVar16 = *pfVar6;
            pfVar6 = cv::Mat::at<float>((Mat *)local_11f8,(int)lap_,local_122c);
            *pfVar6 = (fVar17 - fVar16) + *pfVar6;
          }
        }
      }
      pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_dd0,local_de0);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                 &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_de0);
      cv::MatSize::operator()((MatSize *)&i_4);
      cv::Mat::create(pvVar12,&i_4,0);
      for (local_123c = 0; iVar5 = local_123c,
          pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                               &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage,local_de0),
          iVar5 < *(int *)(pvVar12 + 8); local_123c = local_123c + 1) {
        for (local_1240 = 0; iVar5 = local_1240,
            pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                                ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                                 &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_de0),
            iVar5 < *(int *)(pvVar12 + 0xc); local_1240 = local_1240 + 1) {
          pfVar6 = cv::Mat::at<float>((Mat *)local_11f8,local_123c,local_1240);
          dVar18 = std::exp((double)(ulong)(uint)*pfVar6);
          local_1244 = SUB84(dVar18,0);
          local_1248 = 255.0;
          pfVar6 = std::min<float>(&local_1244,&local_1248);
          fVar16 = *pfVar6;
          pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_dd0,local_de0);
          puVar7 = cv::Mat::at<unsigned_char>(pvVar12,local_123c,local_1240);
          *puVar7 = (uchar)(int)fVar16;
        }
      }
      cv::Mat::~Mat((Mat *)local_1090);
      cv::Mat::~Mat(local_f90);
      cv::Mat::~Mat(local_f30);
      cv::Mat::~Mat(local_ea8);
      cv::Mat::~Mat(local_e40);
    }
    cv::Mat::Mat(local_12a8);
    cv::_InputArray::_InputArray(&local_12c0,(vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_dd0)
    ;
    cv::_OutputArray::_OutputArray(&local_12d8,local_12a8);
    cv::merge(&local_12c0,&local_12d8);
    cv::_OutputArray::~_OutputArray(&local_12d8);
    cv::_InputArray::~_InputArray(&local_12c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_12f8,"reconstructed_img",&local_12f9);
    cv::_InputArray::_InputArray(&local_1318,local_12a8);
    cv::imshow(local_12f8,&local_1318);
    cv::_InputArray::~_InputArray(&local_1318);
    std::__cxx11::string::~string(local_12f8);
    std::allocator<char>::~allocator(&local_12f9);
    cv::waitKey(0);
    img1.field_2._8_4_ = 1;
    cv::Mat::~Mat(local_12a8);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_dd0);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_db0);
    cv::Mat::~Mat(local_bf0);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_9e0);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
               &log_dy.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
               &log_dx.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
               &log_grad.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
               &bgr_channels_log.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    cv::Mat::~Mat((Mat *)&roi.width);
    cv::Mat::~Mat((Mat *)(winname.field_2._M_local_buf + 8));
    cv::Mat::~Mat(local_590);
    cv::Mat::~Mat((Mat *)&i);
    cv::Mat::~Mat(local_4b8);
    cv::Mat::~Mat((Mat *)local_418);
    std::__cxx11::string::~string((string *)local_2c0);
  }
  else {
    cv::CommandLineParser::printMessage();
    img1.field_2._8_4_ = 1;
  }
  cv::CommandLineParser::~CommandLineParser(local_278);
  std::__cxx11::string::~string(local_268);
  cv::Mat::~Mat((Mat *)local_e8);
  cv::Mat::~Mat(local_78);
  return 0;
}

Assistant:

int main(int argc, const char* argv[])
{

    cv::Mat filter_gx(1, 3, CV_32F);
    filter_gx.at<float>(0) = -0.5f;
    filter_gx.at<float>(1) = 0.0f;
    filter_gx.at<float>(2) = 0.5f;
    cv::Mat filter_gy = filter_gx.t();

    const std::string keys =
        "{help h usage ? |      | print this message                                                        }"
        "{@image1        |      | image1 for compare                                                        }"
        "{roi            |      | roi to delete canny edges                                                 }"
        "{thrs1          |200   | Canny threshold for grayscale image                                       }"
        "{thrs2          |200   | Canny threshold for invariant image                                       }"
        "{c1             |0.5463| Illuminant invariant direction c1                                         }"
        "{c2             |-0.837| Illuminant invariant direction c2                                         }"
        "{calibrate      |false | Manually calibrate [c1, c2] direction                                     }"
        "{mode           |1     | 1 = Use roi to clear non shadow edges, 0 = try to figure out shadow edges }"
        ;
    cv::CommandLineParser parser(argc, argv, keys);

    if (parser.has("help"))
    {
        parser.printMessage();
        return 0;
    }

    std::string img1 = parser.get<std::string>(0);
    float img_canny_thrs = parser.get<float>("thrs1");
    float ii_img_canny_thrs = parser.get<float>("thrs2");
    float c1 = parser.get<float>("c1");
    float c2 = parser.get<float>("c2");
    bool calibrate = parser.get<bool>("calibrate");
    int mode = parser.get<int>("mode");

    cv::Mat img = cv::imread(img1);
    //cv::Mat img2;
    //cv::resize(img, img2, cv::Size(img.cols / 2, img.rows / 2));
    //img = img2;
    cv::imshow("Original", img);

    cv::Mat log_r_g(img.rows, img.cols, CV_32F), log_b_g(img.rows, img.cols, CV_32F);
    for (int j = 0; j < img.rows; ++j)
    {
        for (int i = 0; i < img.cols; ++i)
        {
            cv::Vec3b color = img.at<cv::Vec3b>(j, i);
            log_r_g.at<float>(j, i) = 0;
            log_b_g.at<float>(j, i) = 0;
            if (color[1] != 0)
            {
                float scale = color[1];
                if (color[2] != 0)
                    log_r_g.at<float>(j, i) = std::log(color[2] / scale );
                if (color[0] != 0)
                    log_b_g.at<float>(j, i) = std::log(color[0] / scale);
            }
        }
    }

    auto combineLogImages = [](const cv::Mat& log_r_g, const cv::Mat& log_b_g, cv::Mat& img_res, const float c1, const float c2)
    {
        for (int j = 0; j < img_res.rows; ++j)
        {
            for (int i = 0; i < img_res.cols; ++i)
            {
                img_res.at<float>(j, i) = std::abs(c1 * log_r_g.at<float>(j, i) - c2 * log_b_g.at<float>(j, i));
            }
        }
    };

    cv::Mat illuminant_invariant_img(log_r_g.size(), CV_32F);
    combineLogImages(log_r_g, log_b_g, illuminant_invariant_img, c1, c2);
    cv::Mat illuminant_invariant_img_exp;

    if (calibrate)
    {
        //create trackbar window
        const std::string winname = "Invariant direction slider";
        const std::string slider_name = "ids";
        cv::namedWindow(winname, cv::WINDOW_AUTOSIZE); // Create Window
        int val = 0, val_curr = -1;

        int max_val = 1000;
        cv::createTrackbar(slider_name, winname, &val, max_val, onIDSslider);

        bool calib_done = false;
        while (!calib_done)
        {
            if (val != val_curr)
            {
                val_curr = val;
                c1 = std::cos(val / (float)max_val * 2 * 3.141592f);
                c2 = std::sin(val / (float)max_val * 2 * 3.141592f);
                std::cout << c1 << "   " << c2 << std::endl;
                combineLogImages(log_r_g, log_b_g, illuminant_invariant_img, c1, c2);
                cv::exp(illuminant_invariant_img, illuminant_invariant_img_exp);
                cv::imshow(winname, illuminant_invariant_img_exp / 2);
            }
            int key = cv::waitKey(50);
            if (key == 27)
            {
                calib_done = true;
            }
        }
    }
    cv::Mat edges_to_remove;
    if (mode == 0)
    {
        calculateShadowEdges(illuminant_invariant_img, img, edges_to_remove, int(ii_img_canny_thrs), int(img_canny_thrs));
    }
    else if (mode == 1)
    {
        cv::Rect roi(0, 0, img.cols, img.rows);
        if (parser.has("roi"))
        {
            std::string roi_str = parser.get<std::string>("roi");
            auto rois = split(roi_str, "x");
            assert(rois.size() == 4);
            roi.x = int(std::stof(rois[0]) * roi.width);
            roi.y = int(std::stof(rois[1]) * roi.height);
            roi.width = int(std::stof(rois[2]) * roi.width);
            roi.height = int(std::stof(rois[3]) * roi.height);
        }
        calculateShadowEdgesRoi(img, roi, edges_to_remove, int(img_canny_thrs));
    }
    cv::imshow("Edges to remove", edges_to_remove);
    cv::waitKey(1);
    //split color channels and calculate log (color/gradient magnitude) images
    std::vector<cv::Mat> bgr_channels, bgr_channels_log, log_grad, log_dx, log_dy;
    cv::split(img, bgr_channels);
    bgr_channels_log.resize(bgr_channels.size());
    log_grad.resize(bgr_channels.size());
    log_dx.resize(bgr_channels.size());
    log_dy.resize(bgr_channels.size());
    for (size_t i = 0; i < bgr_channels.size(); ++i)
    {
        cv::Mat float_img;
        bgr_channels[i].convertTo(float_img, CV_32F);
        bgr_channels_log[i].create(float_img.size(), CV_32FC1);
        for (int l = 0; l < float_img.rows; ++l)
        {
            for (int k = 0; k < float_img.cols; ++k)
            {
                float int_val = float_img.at<float>(l, k);
                if (int_val < std::numeric_limits<float>::epsilon())
                    int_val = 0.0001f;
                bgr_channels_log[i].at<float>(l, k) = std::log(int_val);
            }
        }
        cv::filter2D(bgr_channels_log[i], log_dx[i], CV_32F, filter_gx);
        cv::filter2D(bgr_channels_log[i], log_dy[i], CV_32F, filter_gy);
        cv::magnitude(log_dx[i], log_dy[i], log_grad[i]);
    }

    //calculate gradient of the illuminant invariant image
    cv::Mat grad_iii;
    {
        cv::Mat dx, dy;
        cv::filter2D(illuminant_invariant_img, dx, CV_32F, filter_gx);
        cv::filter2D(illuminant_invariant_img, dy, CV_32F, filter_gy);
        cv::magnitude(dx, dy, grad_iii);
    }
    //solving for color image
    std::vector<cv::Mat> re_log_channels(bgr_channels.size());
    std::vector<cv::Mat> re_channels(bgr_channels.size());
    //iterate over image channel and remove color edges belonging to shadows, restore original image channels
    for (size_t k = 0; k < bgr_channels.size(); ++k)
    {
        cv::Mat S_x(log_dx[k].size(), CV_32FC1);
        cv::Mat S_y(log_dx[k].size(), CV_32FC1);

        for (int j = 0; j < log_dx[k].rows; ++j)
        {
            for (int i = 0; i < log_dx[k].cols; ++i)
            {
                auto& s_x = S_x.at<float>(j, i);
                auto& s_y = S_y.at<float>(j, i);
                float edge_to_remove = edges_to_remove.at<uchar>(j, i);

                if (edge_to_remove > 100) //shadow edge
                {
                    s_x = 0;
                    s_y = 0;
                }
                else
                {
                    //std::cout << ii_grad << std::endl;
                    s_x = log_dx[k].at<float>(j, i);
                    s_y = log_dy[k].at<float>(j, i);
                }
            }
        }

        //calculate laplacian of the edge map, shadows already removed
        cv::Mat S_x_dx, S_y_dy;
        cv::filter2D(S_x, S_x_dx, CV_32F, filter_gx);
        cv::filter2D(S_y, S_y_dy, CV_32F, filter_gy);
        cv::Mat S_lap = S_x_dx + S_y_dy;

        cv::Mat& u = re_log_channels[k];

        //set boundary to some common value
        u.create(log_dx[k].size(), CV_32FC1);
        u.setTo(std::log(111));

        //lots of iteration required to restore the original image from the laplacian
        for (int it = 0; it < 20000; ++it)
        {
            for (int j = 2; j < log_dx[k].rows - 2; ++j)
            {
                for (int i = 2; i < log_dx[k].cols - 2; ++i)
                {
                    float lap_ = 
                        0.25f * (
                            u.at<float>(j, i - 2) + u.at<float>(j, i + 2) +
                        u.at<float>(j - 2, i) + u.at<float>(j + 2, i) -
                        4.0f * u.at<float>(j, i));
        
        
                    u.at<float>(j, i) +=
                        lap_ - S_lap.at<float>(j, i);
                }
            }
        }

        re_channels[k].create(log_dx[k].size(), CV_8UC1);
        for (int j = 0; j < log_dx[k].rows; ++j)
        {
            for (int i = 0; i < log_dx[k].cols; ++i)
            {
                re_channels[k].at<uint8_t>(j, i) = uint8_t(std::min(std::exp(u.at<float>(j, i)) * 1.f, 255.0f));
            }
        }
    }
    cv::Mat reconstructed_img;
    cv::merge(re_channels, reconstructed_img);

    cv::imshow("reconstructed_img", reconstructed_img);

    cv::waitKey(0);
    return 0;
}